

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O1

ChMatrix33<double> *
chrono::fea::rotutils::DRot_I(ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ActualDstType actualDst;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double coeff [4];
  double dStack_38;
  double local_30;
  double local_20;
  
  RotCo<chrono::ChVector<double>,double>(4,phi,phi,&dStack_38);
  dVar6 = -local_20 / (local_30 + local_30);
  dVar1 = phi->m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  dVar2 = phi->m_data[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2;
  dVar3 = phi->m_data[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3 * -0.5;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2 * -0.5;
  auVar11 = vunpcklpd_avx(auVar17,auVar14);
  auVar9._0_8_ = -(dVar2 * -0.5);
  auVar9._8_8_ = 0x8000000000000000;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1 * -0.5;
  auVar9 = vunpcklpd_avx(auVar9,auVar16);
  dVar4 = dVar1 * dVar6;
  dVar5 = dVar2 * dVar6;
  dVar6 = dVar6 * dVar3;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar6 * dVar3;
  auVar12 = vfnmsub231sd_fma(auVar22,auVar12,auVar21);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * dVar4;
  auVar12 = vunpcklpd_avx(auVar12,auVar26);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar6;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar4 * dVar1;
  auVar14 = vfnmsub231sd_fma(auVar27,auVar19,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2 * dVar6;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1 * dVar6;
  auVar7 = vunpcklpd_avx(auVar24,auVar8);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5 * dVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3 * dVar4;
  auVar8 = vunpcklpd_avx(auVar25,auVar23);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5 * dVar3;
  auVar14 = vunpcklpd_avx(auVar14,auVar20);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar5 * dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4;
  auVar13 = vfnmsub231sd_fma(auVar13,auVar10,auVar18);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = 0.0 - dVar3 * -0.5;
  auVar10 = vunpcklpd_avx(ZEXT816(0x3ff0000000000000),auVar15);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar12._0_8_ + auVar10._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar12._8_8_ + auVar10._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar11._0_8_ + 0.0 + auVar8._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar11._8_8_ + 0.0 + auVar8._8_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = 0.0 - dVar1 * -0.5;
  auVar11 = vunpcklpd_avx(ZEXT816(0x3ff0000000000000),auVar11);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar11._0_8_ + auVar14._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar11._8_8_ + auVar14._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar9._0_8_ + 0.0 + auVar7._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar9._8_8_ + 0.0 + auVar7._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar13._0_8_ + 1.0;
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> DRot_I(const ChVector<>& phi) {
    double coeff[COEFF_D], coeffs[COEFF_C_STAR];

    CoeffCStar(phi, phi, coeff, coeffs);

    ChMatrix33<> Eye(1);
    ChStarMatrix33<> Phix(phi * (-0.5));
    ChStarMatrix33<> pxpx(phi, phi * coeffs[0]);

    return Eye + Phix + pxpx;
}